

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O2

void __thiscall
llvm::DWARFDebugNames::NameIndex::dumpName
          (NameIndex *this,ScopedPrinter *W,NameTableEntry *NTE,Optional<unsigned_int> Hash)

{
  StringRef N;
  Optional<unsigned_int> this_00;
  bool bVar1;
  uint *puVar2;
  raw_ostream *prVar3;
  char *Str;
  StringRef Label;
  Twine local_b8;
  Twine local_a0;
  Child local_88;
  undefined8 uStack_80;
  undefined2 local_78;
  undefined **local_68;
  uint64_t EntryOffset;
  undefined8 local_58;
  OptionalStorage<unsigned_int,_true> local_48;
  Optional<unsigned_int> Hash_local;
  DelimitedScope<___,____> local_38;
  DictScope NameScope;
  
  local_48 = Hash.Storage;
  Twine::Twine(&local_a0,"Name ");
  uStack_80 = 0;
  local_78 = 0x109;
  local_88._4_4_ = 0;
  local_88.decUI = NTE->Index;
  Hash_local.Storage = (OptionalStorage<unsigned_int,_true>)NTE;
  Twine::concat(&local_b8,&local_a0,(Twine *)&local_88);
  Twine::str_abi_cxx11_((string *)&stack0xffffffffffffff98,&local_b8);
  N.Length = EntryOffset;
  N.Data = (char *)local_68;
  DelimitedScope<'{',_'}'>::DelimitedScope(&local_38,W,N);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  this_00 = Hash_local;
  if (((ulong)Hash.Storage >> 0x20 & 1) != 0) {
    puVar2 = optional_detail::OptionalStorage<unsigned_int,_true>::getValue(&local_48);
    Label.Length = 4;
    Label.Data = "Hash";
    ScopedPrinter::printHex<unsigned_int>(W,Label,*puVar2);
  }
  prVar3 = ScopedPrinter::startLine(W);
  local_58 = *(size_type *)((long)this_00.Storage + 0x20);
  EntryOffset = (uint64_t)anon_var_dwarf_2c803a6;
  local_68 = &PTR_home_00e22798;
  raw_ostream::operator<<(prVar3,(format_object_base *)&stack0xffffffffffffff98);
  prVar3 = raw_ostream::operator<<(W->OS," \"");
  Str = NameTableEntry::getString((NameTableEntry *)this_00.Storage);
  prVar3 = raw_ostream::operator<<(prVar3,Str);
  raw_ostream::operator<<(prVar3,"\"\n");
  local_68 = *(undefined ***)((long)this_00.Storage + 0x28);
  do {
    bVar1 = dumpEntry(this,W,(uint64_t *)&stack0xffffffffffffff98);
  } while (bVar1);
  DelimitedScope<'{',_'}'>::~DelimitedScope(&local_38);
  return;
}

Assistant:

void DWARFDebugNames::NameIndex::dumpName(ScopedPrinter &W,
                                          const NameTableEntry &NTE,
                                          Optional<uint32_t> Hash) const {
  DictScope NameScope(W, ("Name " + Twine(NTE.getIndex())).str());
  if (Hash)
    W.printHex("Hash", *Hash);

  W.startLine() << format("String: 0x%08" PRIx64, NTE.getStringOffset());
  W.getOStream() << " \"" << NTE.getString() << "\"\n";

  uint64_t EntryOffset = NTE.getEntryOffset();
  while (dumpEntry(W, &EntryOffset))
    /*empty*/;
}